

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int deflatePending(z_streamp strm,uint *pending,int *bits)

{
  int iVar1;
  int iVar2;
  
  iVar1 = deflateStateCheck(strm);
  iVar2 = -2;
  if (iVar1 == 0) {
    if (pending != (uint *)0x0) {
      *pending = (uint)strm->state->pending;
    }
    iVar2 = 0;
    if (bits != (int *)0x0) {
      *bits = strm->state->bi_valid;
    }
  }
  return iVar2;
}

Assistant:

int ZEXPORT deflatePending(z_streamp strm, unsigned *pending, int *bits) {
    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    if (pending != Z_NULL)
        *pending = strm->state->pending;
    if (bits != Z_NULL)
        *bits = strm->state->bi_valid;
    return Z_OK;
}